

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * CETime::TimeDbl2Vect(double *time)

{
  reference pvVar1;
  double *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar2;
  double dVar3;
  vector<double,_std::allocator<double>_> *time_vect;
  allocator_type *in_stack_ffffffffffffff78;
  value_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  
  std::allocator<double>::allocator((allocator<double> *)0x143ec4);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::allocator<double>::~allocator((allocator<double> *)0x143ee9);
  dVar3 = *in_RSI;
  dVar2 = floor(*in_RSI);
  dVar3 = dVar3 - dVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
  *pvVar1 = dVar3;
  dVar3 = floor(*in_RSI);
  dVar3 = (double)((int)dVar3 % 100);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  *pvVar1 = dVar3;
  dVar3 = *in_RSI;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  dVar3 = floor(dVar3 - *pvVar1);
  dVar3 = (double)(int)((long)((ulong)(uint)((int)((long)(int)dVar3 / 100) >> 0x1f) << 0x20 |
                              (long)(int)dVar3 / 100 & 0xffffffffU) % 100);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  *pvVar1 = dVar3;
  dVar3 = *in_RSI;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  dVar2 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  dVar3 = floor((dVar3 - dVar2) - *pvVar1);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar1 = (double)(int)(dVar3 / 10000.0);
  return in_RDI;
}

Assistant:

std::vector<double> CETime::TimeDbl2Vect(const double& time)
{
    // Create a vector to hold the information
    std::vector<double> time_vect(4,0.0) ;
    
    // Get the seconds fraction
    time_vect[3] = time - std::floor(time) ;
    // Get the seconds value
    time_vect[2] = int(std::floor(time)) % 100 ;
    // Get the minutes
    time_vect[1] = int(std::floor(time - time_vect[2]))/100 % 100 ;
    // Get the hours
    time_vect[0] = int(std::floor(time - time_vect[2] - time_vect[1])/10000) ;
    
    return time_vect ;
}